

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void c4::handle_error(srcloc where,char *fmt,...)

{
  char in_AL;
  uint uVar1;
  undefined8 in_RCX;
  uint uVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined1 local_4d8 [24];
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined8 local_438;
  char buf [1024];
  
  if (in_AL != '\0') {
    local_4a8 = in_XMM0_Qa;
    local_498 = in_XMM1_Qa;
    local_488 = in_XMM2_Qa;
    local_478 = in_XMM3_Qa;
    local_468 = in_XMM4_Qa;
    local_458 = in_XMM5_Qa;
    local_448 = in_XMM6_Qa;
    local_438 = in_XMM7_Qa;
  }
  local_4c0 = in_RCX;
  local_4b8 = in_R8;
  local_4b0 = in_R9;
  if ((s_error_flags & 6) == 0) {
    uVar2 = 0;
  }
  else {
    args[0].reg_save_area = local_4d8;
    args[0].overflow_arg_area = &stack0x00000008;
    args[0].gp_offset = 0x18;
    args[0].fp_offset = 0x30;
    uVar1 = vsnprintf(buf,0x400,fmt,args);
    uVar2 = 0x3ff;
    if (uVar1 < 0x3ff) {
      uVar2 = uVar1;
    }
  }
  if ((s_error_flags & 2) != 0) {
    fputc(10,_stderr);
    fflush(_stderr);
    fprintf(_stderr,"%s:%d: ERROR: %s\n");
    fflush(_stderr);
  }
  if ((s_error_callback != (code *)0x0 & (byte)s_error_flags >> 2) == 1) {
    (*s_error_callback)(buf,uVar2);
  }
  if (((s_error_flags & 8) == 0) && ((s_error_flags & 0x10) == 0)) {
    return;
  }
  abort();
}

Assistant:

void handle_error(srcloc where, const char *fmt, ...)
{
    char buf[1024];
    size_t msglen = 0;
    if(s_error_flags & (ON_ERROR_LOG|ON_ERROR_CALLBACK))
    {
        va_list args;
        va_start(args, fmt);
        int ilen = vsnprintf(buf, sizeof(buf), fmt, args); // ss.vprintf(fmt, args);
        va_end(args);
        msglen = ilen >= 0 && ilen < (int)sizeof(buf) ? static_cast<size_t>(ilen) : sizeof(buf)-1;
    }

    if(s_error_flags & ON_ERROR_LOG)
    {
        C4_LOGF_ERR("\n");
#if defined(C4_ERROR_SHOWS_FILELINE) && defined(C4_ERROR_SHOWS_FUNC)
        C4_LOGF_ERR("%s:%d: ERROR: %s\n", where.file, where.line, buf);
        C4_LOGF_ERR("%s:%d: ERROR here: %s\n", where.file, where.line, where.func);
#elif defined(C4_ERROR_SHOWS_FILELINE)
        C4_LOGF_ERR("%s:%d: ERROR: %s\n", where.file, where.line, buf);
#elif ! defined(C4_ERROR_SHOWS_FUNC)
        C4_LOGF_ERR("ERROR: %s\n", buf);
#endif
    }

    if(s_error_flags & ON_ERROR_CALLBACK)
    {
        if(s_error_callback)
        {
            s_error_callback(buf, msglen/*ss.c_strp(), ss.tellp()*/);
        }
    }

    if(s_error_flags & ON_ERROR_ABORT)
    {
        abort();
    }

    if(s_error_flags & ON_ERROR_THROW)
    {
#if defined(C4_EXCEPTIONS_ENABLED) && defined(C4_ERROR_THROWS_EXCEPTION)
        throw Exception(buf);
#else
        abort();
#endif
    }
}